

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_enum_util_test.cc
# Opt level: O2

Header __thiscall
google::protobuf::internal::anon_unknown_0::ExtractHeader
          (anon_unknown_0 *this,Span<const_unsigned_int> data)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  reference puVar4;
  Span<const_unsigned_int> data_local;
  
  data_local.len_ = (size_type)data.ptr_;
  data_local.ptr_ = (pointer)this;
  puVar4 = absl::lts_20250127::Span<const_unsigned_int>::operator[](&data_local,0);
  uVar2 = *puVar4;
  puVar4 = absl::lts_20250127::Span<const_unsigned_int>::operator[](&data_local,0);
  uVar1 = *(ushort *)((long)puVar4 + 2);
  puVar4 = absl::lts_20250127::Span<const_unsigned_int>::operator[](&data_local,1);
  uVar3 = *puVar4;
  puVar4 = absl::lts_20250127::Span<const_unsigned_int>::operator[](&data_local,1);
  return (Header)((ulong)(ushort)uVar3 << 0x20 | (ulong)*(ushort *)((long)puVar4 + 2) << 0x30 |
                  (ulong)uVar1 << 0x10 | (ulong)(ushort)uVar2);
}

Assistant:

Header ExtractHeader(absl::Span<const uint32_t> data) {
  return {
      static_cast<int16_t>(Unmake32(data[0])[0]),
      Unmake32(data[0])[1],
      Unmake32(data[1])[0],
      Unmake32(data[1])[1],
  };
}